

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O1

bool __thiscall QUnixPrintWidgetPrivate::checkFields(QUnixPrintWidgetPrivate *this)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  QPrintDialog *pQVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QFileInfo fi;
  QArrayData *local_b8 [3];
  QArrayData *local_a0 [3];
  QArrayData *local_88 [3];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)((this->widget).super_Ui_QPrintWidget.filename + 0x20) + 8) & 1) == 0) {
    local_58.d.size = -0x5555555555555556;
    local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QLineEdit::text();
    local_68 = 0xaaaaaaaaaaaaaaaa;
    uStack_60 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_68,&local_58);
    local_70 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_70,(QFileDevice *)&local_68);
    cVar1 = QFileInfo::exists();
    if (cVar1 == '\0') {
LAB_0014512a:
      cVar2 = QFile::open(&local_68,4);
      if (cVar2 == '\0') {
LAB_00145255:
        pQVar5 = this->q;
        QWidget::windowTitle();
        iVar4 = 0x15808a;
        goto LAB_0014527a;
      }
      if (cVar1 != '\0') {
        pQVar5 = this->q;
        QWidget::windowTitle();
        QMetaObject::tr((char *)local_b8,(char *)&QPrintDialog::staticMetaObject,0x1580c8);
        QVar6.m_size = (size_t)local_b8;
        QVar6.field_0.m_data = local_a0;
        QString::arg_impl(QVar6,(int)local_58.d.ptr,(QChar)(char16_t)local_58.d.size);
        iVar4 = QMessageBox::question(pQVar5,local_88,local_a0,0x14000,0x10000);
        if (local_a0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0[0],2,0x10);
          }
        }
        if (local_b8[0] != (QArrayData *)0x0) {
          LOCK();
          (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8[0],2,0x10);
          }
        }
        if (local_88[0] != (QArrayData *)0x0) {
          LOCK();
          (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88[0],2,0x10);
          }
        }
        if (iVar4 != 0x10000) {
          QFileDevice::close();
          bVar3 = true;
          if (cVar1 == '\0') goto LAB_00145344;
          goto LAB_00145351;
        }
        goto LAB_00145336;
      }
      QFileDevice::close();
LAB_00145344:
      QFile::remove();
      bVar3 = true;
    }
    else {
      cVar2 = QFileInfo::isDir();
      if (cVar2 == '\0') {
        if ((cVar1 == '\0') || (cVar2 = QFileInfo::isWritable(), cVar2 != '\0')) goto LAB_0014512a;
        goto LAB_00145255;
      }
      pQVar5 = this->q;
      QWidget::windowTitle();
      iVar4 = 0x158052;
LAB_0014527a:
      QMetaObject::tr((char *)local_b8,(char *)&QPrintDialog::staticMetaObject,iVar4);
      QVar7.m_size = (size_t)local_b8;
      QVar7.field_0.m_data = local_a0;
      QString::arg_impl(QVar7,(int)local_58.d.ptr,(QChar)(char16_t)local_58.d.size);
      QMessageBox::warning(pQVar5,local_88,local_a0,0x400,0);
      if (local_a0[0] != (QArrayData *)0x0) {
        LOCK();
        (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0[0],2,0x10);
        }
      }
      if (local_b8[0] != (QArrayData *)0x0) {
        LOCK();
        (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8[0],2,0x10);
        }
      }
      if (local_88[0] != (QArrayData *)0x0) {
        LOCK();
        (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88[0],2,0x10);
        }
      }
LAB_00145336:
      bVar3 = false;
    }
LAB_00145351:
    QFileInfo::~QFileInfo((QFileInfo *)&local_70);
    QFile::~QFile((QFile *)&local_68);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar3) {
      bVar3 = false;
      goto LAB_00145393;
    }
  }
  bVar3 = true;
LAB_00145393:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QUnixPrintWidgetPrivate::checkFields()
{
    if (widget.filename->isEnabled()) {
        QString file = widget.filename->text();
        QFile f(file);
        QFileInfo fi(f);
        bool exists = fi.exists();
        bool opened = false;
        if (exists && fi.isDir()) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("%1 is a directory.\nPlease choose a different file name.").arg(file));
            return false;
        } else if ((exists && !fi.isWritable()) || !(opened = f.open(QFile::Append))) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("File %1 is not writable.\nPlease choose a different file name.").arg(file));
            return false;
        } else if (exists) {
            int ret = QMessageBox::question(q, q->windowTitle(),
                                            QPrintDialog::tr("%1 already exists.\nDo you want to overwrite it?").arg(file),
                                            QMessageBox::Yes|QMessageBox::No, QMessageBox::No);
            if (ret == QMessageBox::No)
                return false;
        }
        if (opened) {
            f.close();
            if (!exists)
                f.remove();
        }
    }

#if QT_CONFIG(cups)
    if (propertiesDialog) {
        QCUPSSupport::PagesPerSheet pagesPerSheet = qvariant_cast<QCUPSSupport::PagesPerSheet>(propertiesDialog->widget.pageSetup->m_ui.pagesPerSheetCombo
                                                                    ->currentData());

        QCUPSSupport::PageSet pageSet = qvariant_cast<QCUPSSupport::PageSet>(optionsPane->options.pageSetCombo->currentData());


        if (pagesPerSheet != QCUPSSupport::OnePagePerSheet
            && pageSet != QCUPSSupport::AllPages) {
            QMessageBox::warning(q, q->windowTitle(),
                                 QPrintDialog::tr("Options 'Pages Per Sheet' and 'Page Set' cannot be used together.\nPlease turn one of those options off."));
            return false;
        }
    }
#endif

    // Every test passed. Accept the dialog.
    return true;
}